

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O3

void * lace_worker_thread(void *arg)

{
  ushort uVar1;
  WorkerP *self;
  uint uVar2;
  uint uVar3;
  Task *__dq_head;
  ulong uVar4;
  Worker **ppWVar5;
  Worker **ppWVar6;
  Worker **ppWVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long in_FS_OFFSET;
  
  lace_init_worker((uint)arg);
  sem_wait((sem_t *)&suspend_semaphore);
  LOCK();
  workers_running = workers_running + 1;
  UNLOCK();
  self = *(WorkerP **)(in_FS_OFFSET + -8);
  __dq_head = lace_get_head(self);
  uVar2 = n_workers;
  uVar1 = self->worker;
  uVar10 = (uint)uVar1;
  uVar4 = (ulong)n_workers;
  ppWVar7 = (Worker **)((ulong)((uint)uVar1 * 8) + (long)workers);
  if (lace_quits == 0) {
    uVar3 = n_workers - 1;
    uVar8 = 0;
    ppWVar6 = ppWVar7;
    do {
      if (1 < uVar2) {
        if ((int)uVar8 < 1) {
          iVar9 = uVar10 * 0x41c64e6d;
          uVar10 = uVar10 * -0x3d5d6597 + 0xd3dc167e;
          uVar8 = (iVar9 + 0x3039U) % 0x28;
          ppWVar6 = workers + (ulong)(uVar1 + 1 + uVar10 % uVar3) % (ulong)uVar2;
        }
        else {
          uVar8 = uVar8 - 1;
          ppWVar5 = ppWVar6 + 2;
          if (ppWVar6 + 1 != ppWVar7) {
            ppWVar5 = ppWVar6 + 1;
          }
          if (workers + uVar4 <= ppWVar5) {
            ppWVar5 = workers;
          }
          ppWVar6 = ppWVar5 + (ppWVar5 == ppWVar7);
        }
        lace_steal(self,__dq_head,*ppWVar6);
      }
      if (lace_newframe.t != (Task *)0x0) {
        lace_yield(self,__dq_head);
      }
      if (external_task != (ExtTask *)0x0) {
        lace_steal_external(self,__dq_head);
      }
      if (must_suspend != 0) {
        lace_worker_thread_cold_1();
      }
    } while (lace_quits == 0);
  }
  LOCK();
  workers_running = workers_running - 1;
  UNLOCK();
  return (void *)0x0;
}

Assistant:

static void*
lace_worker_thread(void* arg)
{
    int worker = (int)(size_t)arg;

    // Initialize data structures
    lace_init_worker(worker);

    // Pin CPU
    lace_pin_worker();

    // Wait for the first time we are resumed
    sem_wait(&suspend_semaphore);

    // Signal that we are running
    workers_running += 1;

    // Run the steal loop
    WorkerP *__lace_worker = lace_get_worker();
    Task *__lace_dq_head = lace_get_head(__lace_worker);
    lace_steal_loop_WORK(__lace_worker, __lace_dq_head, &lace_quits);

    // Time worker exit event
    lace_time_event(__lace_worker, 9);

    // Signal that we stopped
    workers_running -= 1;

    return NULL;
}